

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::EndPLTerm(void *param_1,IDType param_2)

{
  Argument1 in_stack_ffffffffffffff88;
  allocator<char> local_49;
  string local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  BasicTestExpr<0> *local_28;
  PLTermBuilder *local_20;
  void *local_18;
  BasicTestExpr<0> local_c;
  PLTermBuilder local_5;
  BasicTestExpr<0> local_4;
  
  local_20 = &local_5;
  local_28 = &local_c;
  local_18 = param_1;
  local_c.id_ = param_2;
  internal::
  Unused<mp::ProblemBuilder<TestProblemBuilder,BasicTestExpr<0>>::PLTermBuilder*,BasicTestExpr<0>*>
            (&local_20,&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TestProblemBuilder::ReportUnhandledConstruct
            ((TestProblemBuilder *)param_1,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (NumericExpr)local_4.id_;
}

Assistant:

NumericExpr EndPLTerm(PLTermBuilder builder, Reference arg) {
    internal::Unused(&builder, &arg);
    MP_DISPATCH(ReportUnhandledConstruct("piecewise-linear term"));
    return NumericExpr();
  }